

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O2

void __thiscall lsim::SimCircuit::write_byte(SimCircuit *this,pin_id_container_t *pins,uint8_t data)

{
  pointer puVar1;
  SimComponent *this_00;
  pointer puVar2;
  ulong uVar3;
  
  puVar1 = (pins->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pins->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar2 - (long)puVar1 != 0x40) {
    __assert_fail("pins.size() == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                  ,0xbb,"void lsim::SimCircuit::write_byte(const pin_id_container_t &, uint8_t)");
  }
  uVar3 = 0;
  while( true ) {
    if ((ulong)((long)puVar2 - (long)puVar1 >> 3) <= uVar3) {
      return;
    }
    this_00 = component_by_id(this,*(uint32_t *)((long)puVar1 + uVar3 * 8 + 4));
    if (this_00 == (SimComponent *)0x0) break;
    SimComponent::set_user_value
              (this_00,(uint32_t)
                       (pins->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar3],
               (uint)((data >> ((uint)uVar3 & 0x1f) & 1) != 0));
    uVar3 = uVar3 + 1;
    puVar1 = (pins->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (pins->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  __assert_fail("comp",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0xc1,"void lsim::SimCircuit::write_byte(const pin_id_container_t &, uint8_t)");
}

Assistant:

void SimCircuit::write_byte(const pin_id_container_t &pins, uint8_t data) {
    assert(pins.size() == 8);

    for (size_t idx = 0; idx < pins.size(); ++idx) {
        auto value = static_cast<Value>((data >> idx) & 1);

        auto comp = component_by_id(component_id_from_pin_id(pins[idx]));
        assert(comp);
        comp->set_user_value(pin_index_from_pin_id(pins[idx]), value);
    }
}